

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::SetHookState(Debugger *this,shared_ptr<HookState> *newState)

{
  uint uVar1;
  element_type *peVar2;
  enable_shared_from_this<Debugger> local_40;
  shared_ptr<HookState> local_30;
  lua_State *local_20;
  lua_State *L;
  shared_ptr<HookState> *newState_local;
  Debugger *this_local;
  
  if (this->currentL != (lua_State *)0x0) {
    local_20 = this->currentL;
    L = (lua_State *)newState;
    newState_local = (shared_ptr<HookState> *)this;
    std::shared_ptr<HookState>::shared_ptr(&local_30,(nullptr_t)0x0);
    std::shared_ptr<HookState>::operator=(&this->hookState,&local_30);
    std::shared_ptr<HookState>::~shared_ptr(&local_30);
    peVar2 = std::__shared_ptr_access<HookState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<HookState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        newState);
    std::enable_shared_from_this<Debugger>::shared_from_this(&local_40);
    uVar1 = (*peVar2->_vptr_HookState[2])(peVar2,&local_40,local_20);
    std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)&local_40);
    if ((uVar1 & 1) != 0) {
      std::shared_ptr<HookState>::operator=(&this->hookState,newState);
    }
  }
  return;
}

Assistant:

void Debugger::SetHookState(std::shared_ptr<HookState> newState) {
	if (!currentL) {
		return;
	}

	auto L = currentL;

	hookState = nullptr;
	if (newState->Start(shared_from_this(), L)) {
		hookState = newState;
	}
}